

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::makeLargeShrS
          (I64ToI32Lowering *this,Index highBits,Index leftHigh,Index shift)

{
  Index IVar1;
  Index index;
  pointer this_00;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  LocalGet *pLVar5;
  Const *right;
  Binary *pBVar6;
  LocalSet *any;
  LocalGet *right_00;
  Block *pBVar7;
  Type local_38;
  Type local_30;
  Type local_28;
  Index local_1c;
  Index local_18;
  Index shift_local;
  Index leftHigh_local;
  Index highBits_local;
  I64ToI32Lowering *this_local;
  
  local_1c = shift;
  local_18 = leftHigh;
  shift_local = highBits;
  _leftHigh_local = this;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  index = shift_local;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = local_18;
  wasm::Type::Type(&local_28,i32);
  pLVar5 = Builder::makeLocalGet(pBVar4,IVar1,local_28);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  right = Builder::makeConst<int>(pBVar4,0x1f);
  pBVar6 = Builder::makeBinary(pBVar3,ShrSInt32,(Expression *)pLVar5,(Expression *)right);
  any = Builder::makeLocalSet(pBVar2,index,(Expression *)pBVar6);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = local_18;
  wasm::Type::Type(&local_30,i32);
  pLVar5 = Builder::makeLocalGet(pBVar3,IVar1,local_30);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = local_1c;
  wasm::Type::Type(&local_38,i32);
  right_00 = Builder::makeLocalGet(pBVar3,IVar1,local_38);
  pBVar6 = Builder::makeBinary(pBVar2,ShrSInt32,(Expression *)pLVar5,(Expression *)right_00);
  pBVar7 = Builder::blockify(this_00,(Expression *)any,(Expression *)pBVar6);
  return pBVar7;
}

Assistant:

Block* makeLargeShrS(Index highBits, Index leftHigh, Index shift) {
    return builder->blockify(
      builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShrSInt32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeConst(int32_t(31)))),
      builder->makeBinary(ShrSInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(shift, Type::i32)));
  }